

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O2

void wasm::ABI::getStackSpace(Index local,Function *func,Index size,Module *wasm)

{
  ExpressionList *this;
  ExpressionList *this_00;
  HeapType *this_01;
  pointer puVar1;
  Expression *item;
  size_t sVar2;
  char *pcVar3;
  Function *func_00;
  Index IVar4;
  Global *pGVar5;
  GlobalGet *value;
  LocalSet *pLVar6;
  LocalGet *pLVar7;
  Const *right;
  Binary *value_00;
  GlobalSet *pGVar8;
  Return *pRVar9;
  Block *this_02;
  undefined1 auVar10 [8];
  uintptr_t uVar11;
  Signature SVar12;
  undefined1 local_228 [8];
  anon_class_32_4_3ed16325 makeStackRestore;
  undefined1 local_a0 [8];
  FindAllPointers<wasm::Return> finder;
  Global *stackPointer;
  uintptr_t local_68;
  Block *local_60;
  Expression **local_58;
  Function *local_50;
  Expression **local_48;
  Index local_40;
  Index local_3c;
  Index local_local;
  Builder builder;
  
  local_50 = func;
  local_40 = local;
  pGVar5 = getStackPointerGlobal(wasm);
  finder.list.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pGVar5;
  if (pGVar5 == (Global *)0x0) {
    Fatal::Fatal((Fatal *)local_228);
    Fatal::operator<<((Fatal *)local_228,
                      (char (*) [48])"getStackSpace: failed to find the stack pointer");
    Fatal::~Fatal((Fatal *)local_228);
  }
  puVar1 = (wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_58 = (Expression **)CONCAT44(local_58._4_4_,local);
  if (puVar1 == (wasm->memories).
                super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    uVar11 = 2;
  }
  else {
    uVar11 = (((puVar1->_M_t).
               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
               super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->indexType).id;
  }
  local_68 = uVar11;
  _local_local = wasm;
  local_60 = MixedArena::alloc<wasm::Block>(&wasm->allocator);
  this = &local_60->list;
  sVar2 = (pGVar5->super_Importable).super_Named.name.super_IString.str._M_len;
  pcVar3 = (pGVar5->super_Importable).super_Named.name.super_IString.str._M_str;
  value = MixedArena::alloc<wasm::GlobalGet>(&wasm->allocator);
  (value->name).super_IString.str._M_len = sVar2;
  (value->name).super_IString.str._M_str = pcVar3;
  (value->super_SpecificExpression<(wasm::Expression::Id)10>).super_Expression.type.id = uVar11;
  pLVar6 = Builder::makeLocalSet((Builder *)&local_local,(Index)local_58,(Expression *)value);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&this->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)pLVar6);
  IVar4 = local_40;
  if (local_68 == 2) {
    pLVar7 = MixedArena::alloc<wasm::LocalGet>(&_local_local->allocator);
    pLVar7->index = IVar4;
    (pLVar7->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
    right = Builder::makeConst<int>((Builder *)&local_local,size + 0xf & 0xfffffff0);
    value_00 = Builder::makeBinary((Builder *)&local_local,SubInt32,(Expression *)pLVar7,
                                   (Expression *)right);
    pGVar8 = Builder::makeGlobalSet
                       ((Builder *)&local_local,
                        (IString)*(IString *)
                                  finder.list.
                                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (Expression *)value_00);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)pGVar8);
    makeStackRestore.stackPointer = (Global **)&local_40;
    makeStackRestore.local = (Index *)&local_68;
    local_48 = &local_50->body;
    local_228 = (undefined1  [8])&local_local;
    makeStackRestore.builder =
         (Builder *)
         &finder.list.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
    FindAllPointers<wasm::Return>::FindAllPointers
              ((FindAllPointers<wasm::Return> *)local_a0,local_48);
    for (auVar10 = local_a0; func_00 = local_50,
        auVar10 !=
        (undefined1  [8])
        finder.list.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
        _M_impl.super__Vector_impl_data._M_start; auVar10 = (undefined1  [8])((long)auVar10 + 8)) {
      local_58 = *(Expression ***)auVar10;
      pRVar9 = Expression::cast<wasm::Return>(*local_58);
      if ((pRVar9->value == (Expression *)0x0) || ((pRVar9->value->type).id == 1)) {
        pGVar8 = getStackSpace::anon_class_32_4_3ed16325::operator()
                           ((anon_class_32_4_3ed16325 *)local_228);
        this_02 = Builder::makeSequence
                            ((Builder *)&local_local,(Expression *)pGVar8,(Expression *)pRVar9);
      }
      else {
        this_02 = MixedArena::alloc<wasm::Block>(&_local_local->allocator);
        local_3c = Builder::addVar(local_50,(Type)(pRVar9->value->type).id);
        pLVar6 = Builder::makeLocalSet((Builder *)&local_local,local_3c,pRVar9->value);
        this_00 = &this_02->list;
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&this_00->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pLVar6);
        pGVar8 = getStackSpace::anon_class_32_4_3ed16325::operator()
                           ((anon_class_32_4_3ed16325 *)local_228);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&this_00->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pGVar8);
        uVar11 = (pRVar9->value->type).id;
        pLVar7 = MixedArena::alloc<wasm::LocalGet>(&_local_local->allocator);
        pLVar7->index = local_3c;
        (pLVar7->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
             uVar11;
        pRVar9 = MixedArena::alloc<wasm::Return>(&_local_local->allocator);
        pRVar9->value = (Expression *)pLVar7;
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&this_00->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pRVar9);
        Block::finalize(this_02);
      }
      *local_58 = (Expression *)this_02;
    }
    item = *local_48;
    uVar11 = (item->type).id;
    if (uVar11 == 0) {
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 item);
      pGVar8 = getStackSpace::anon_class_32_4_3ed16325::operator()
                         ((anon_class_32_4_3ed16325 *)local_228);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pGVar8);
    }
    else if (uVar11 == 1) {
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 item);
    }
    else {
      this_01 = &local_50->type;
      SVar12 = HeapType::getSignature(this_01);
      IVar4 = Builder::addVar(func_00,SVar12.results.id);
      pLVar6 = Builder::makeLocalSet((Builder *)&local_local,IVar4,*local_48);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pLVar6);
      pGVar8 = getStackSpace::anon_class_32_4_3ed16325::operator()
                         ((anon_class_32_4_3ed16325 *)local_228);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pGVar8);
      SVar12 = HeapType::getSignature(this_01);
      pLVar7 = MixedArena::alloc<wasm::LocalGet>(&_local_local->allocator);
      pLVar7->index = IVar4;
      (pLVar7->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
           SVar12.results.id.id;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pLVar7);
    }
    Block::finalize(local_60);
    *local_48 = (Expression *)local_60;
    std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)local_a0);
    return;
  }
  handle_unreachable("unhandled pointerType",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/abi/stack.h"
                     ,0x44);
}

Assistant:

inline void
getStackSpace(Index local, Function* func, Index size, Module& wasm) {
  auto* stackPointer = getStackPointerGlobal(wasm);
  if (!stackPointer) {
    Fatal() << "getStackSpace: failed to find the stack pointer";
  }
  // align the size
  size = stackAlign(size);
  auto pointerType =
    !wasm.memories.empty() ? wasm.memories[0]->indexType : Type::i32;
  // TODO: find existing stack usage, and add on top of that - carefully
  Builder builder(wasm);
  auto* block = builder.makeBlock();
  block->list.push_back(builder.makeLocalSet(
    local, builder.makeGlobalGet(stackPointer->name, pointerType)));
  // TODO: add stack max check
  Expression* added;
  if (pointerType == Type::i32) {
    // The stack goes downward in the LLVM wasm backend.
    added = builder.makeBinary(SubInt32,
                               builder.makeLocalGet(local, pointerType),
                               builder.makeConst(int32_t(size)));
  } else {
    WASM_UNREACHABLE("unhandled pointerType");
  }
  block->list.push_back(builder.makeGlobalSet(stackPointer->name, added));
  auto makeStackRestore = [&]() {
    return builder.makeGlobalSet(stackPointer->name,
                                 builder.makeLocalGet(local, pointerType));
  };
  // add stack restores to the returns
  FindAllPointers<Return> finder(func->body);
  for (auto** ptr : finder.list) {
    auto* ret = (*ptr)->cast<Return>();
    if (ret->value && ret->value->type != Type::unreachable) {
      // handle the returned value
      auto* block = builder.makeBlock();
      auto temp = builder.addVar(func, ret->value->type);
      block->list.push_back(builder.makeLocalSet(temp, ret->value));
      block->list.push_back(makeStackRestore());
      block->list.push_back(
        builder.makeReturn(builder.makeLocalGet(temp, ret->value->type)));
      block->finalize();
      *ptr = block;
    } else {
      // restore, then return
      *ptr = builder.makeSequence(makeStackRestore(), ret);
    }
  }
  // add stack restores to the body
  if (func->body->type == Type::none) {
    block->list.push_back(func->body);
    block->list.push_back(makeStackRestore());
  } else if (func->body->type == Type::unreachable) {
    block->list.push_back(func->body);
    // no need to restore the old stack value, we're gone anyhow
  } else {
    // save the return value
    auto temp = builder.addVar(func, func->getResults());
    block->list.push_back(builder.makeLocalSet(temp, func->body));
    block->list.push_back(makeStackRestore());
    block->list.push_back(builder.makeLocalGet(temp, func->getResults()));
  }
  block->finalize();
  func->body = block;
}